

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O2

void Ifn_NtkAddConstraints(Ifn_Ntk_t *p,sat_solver *pSat)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *vMemory;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  word uTruth;
  int pVars [11];
  word pTruth [4];
  
  vMemory = Vec_IntAlloc(0);
  if (0x40 < (uint)p->nVars) {
    __assert_fail("nBits >= 0 && nBits <= 64",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                  ,0xc2,"word Abc_Tt6Mask(int)");
  }
  uTruth = Abc_Tt6Stretch(~(0xffffffffffffffffU >> (-(char)p->nVars & 0x3fU)),p->nParsVNum);
  if (p->nParsVNum < 5) {
    if (uTruth != 0) {
      iVar6 = 0;
      iVar2 = Kit_TruthIsop((uint *)&uTruth,p->nParsVNum,vMemory,0);
      if (iVar2 != 0) {
        __assert_fail("RetValue == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                      ,0x427,"void Ifn_NtkAddConstraints(Ifn_Ntk_t *, sat_solver *)");
      }
      for (; iVar6 < p->nInps; iVar6 = iVar6 + 1) {
        uVar4 = p->nParsVNum;
        uVar3 = 0;
        if (0 < (int)uVar4) {
          uVar3 = (ulong)uVar4;
        }
        for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
          pVars[uVar5] = uVar4 * iVar6 + (int)uVar5 + p->nParsVIni;
        }
        Ifn_NtkAddConstrOne(pSat,vMemory,pVars,uVar4);
      }
    }
    if (p->nConstr != 0) {
      uVar4 = (uint)(p->nVars == p->nInps);
      Ifn_TtComparisonConstr(pTruth,p->nParsVNum,uVar4,uVar4);
      lVar7 = 0;
      iVar2 = Kit_TruthIsop((uint *)pTruth,p->nParsVNum * 2,vMemory,0);
      if (iVar2 != 0) {
        __assert_fail("RetValue == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                      ,0x439,"void Ifn_NtkAddConstraints(Ifn_Ntk_t *, sat_solver *)");
      }
      for (; lVar7 < p->nConstr; lVar7 = lVar7 + 1) {
        uVar4 = p->pConstr[lVar7];
        uVar1 = p->nParsVNum;
        uVar3 = 0;
        if (0 < (int)uVar1) {
          uVar3 = (ulong)uVar1;
        }
        for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
          iVar2 = p->nParsVIni;
          pVars[uVar5 * 2] = ((int)uVar4 >> 0x10) * uVar1 + (int)uVar5 + iVar2;
          pVars[uVar5 * 2 + 1] = (uVar4 & 0xffff) * uVar1 + (int)uVar5 + iVar2;
        }
        Ifn_NtkAddConstrOne(pSat,vMemory,pVars,uVar1 * 2);
      }
    }
    Vec_IntFree(vMemory);
    return;
  }
  __assert_fail("p->nParsVNum <= 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                ,0x422,"void Ifn_NtkAddConstraints(Ifn_Ntk_t *, sat_solver *)");
}

Assistant:

void Ifn_NtkAddConstraints( Ifn_Ntk_t * p, sat_solver * pSat )
{
    int fAddConstr = 1;
    Vec_Int_t * vCover = Vec_IntAlloc( 0 );
    word uTruth = Abc_Tt6Stretch( ~Abc_Tt6Mask(p->nVars), p->nParsVNum );
    assert( p->nParsVNum <= 4 );
    if ( uTruth )
    {
        int i, k, pVars[IFN_INS];
        int RetValue = Kit_TruthIsop( (unsigned *)&uTruth, p->nParsVNum, vCover, 0 );
        assert( RetValue == 0 );
//        Dau_DsdPrintFromTruth( &uTruth, p->nParsVNum );
        // add capacity constraints
        for ( i = 0; i < p->nInps; i++ )
        {
            for ( k = 0; k < p->nParsVNum; k++ )
                pVars[k] = p->nParsVIni + i * p->nParsVNum + k;
            Ifn_NtkAddConstrOne( pSat, vCover, pVars, p->nParsVNum );
        }
    }
    // ordering constraints
    if ( fAddConstr && p->nConstr )
    {
        word pTruth[4];
        int i, k, RetValue, pVars[2*IFN_INS];
        int fForceDiff = (p->nVars == p->nInps);
        Ifn_TtComparisonConstr( pTruth, p->nParsVNum, fForceDiff, fForceDiff );
        RetValue = Kit_TruthIsop( (unsigned *)pTruth, 2*p->nParsVNum, vCover, 0 );
        assert( RetValue == 0 );
//        Kit_TruthIsopPrintCover( vCover, 2*p->nParsVNum, 0 );
        for ( i = 0; i < p->nConstr; i++ )
        {
            int iVar1 = p->pConstr[i] >> 16;
            int iVar2 = p->pConstr[i] & 0xFFFF;
            for ( k = 0; k < p->nParsVNum; k++ )
            {
                pVars[2*k+0] = p->nParsVIni + iVar1 * p->nParsVNum + k;
                pVars[2*k+1] = p->nParsVIni + iVar2 * p->nParsVNum + k;
            }
            Ifn_NtkAddConstrOne( pSat, vCover, pVars, 2*p->nParsVNum );
//            printf( "added constraint with %d clauses for %d and %d\n", Vec_IntSize(vCover), iVar1, iVar2 );
        }
    }
    Vec_IntFree( vCover );
}